

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RenameMemoryToRegister
               (ExpressionContext *ctx,VmModule *module,VmBlock *block,
               SmallArray<VmValue_*,_32U> *stack,VariableData *variable,
               ArrayView<VmInstruction_*> phiNodes)

{
  SynIdentifier *pSVar1;
  TypeBase *type;
  VmBlock *pVVar2;
  undefined1 auVar3 [12];
  ArrayView<VmInstruction_*> phiNodes_00;
  VmInstruction *original;
  VariableData *pVVar4;
  SmallArray<VmValue_*,_32U> *pSVar5;
  VmModule *pVVar6;
  bool bVar7;
  uint uVar8;
  VmValue **ppVVar9;
  TypeRef *structType;
  VmConstant *pVVar10;
  VmValue *pVVar11;
  VmBlock **ppVVar12;
  ArrayView<VmInstruction_*> phiNodes_01;
  ArrayView<VmInstruction_*> phiNodes_02;
  bool local_129;
  uint local_f4;
  uint i_1;
  VmInstruction *local_e0;
  VmInstruction *inst_1;
  uint k;
  uint j;
  VmBlock *successor;
  uint i;
  VmValue *loadInst_2;
  VmConstant *constant_1;
  undefined1 local_a8 [8];
  VmType vmType;
  VmValue *loadInst_1;
  VmValue *local_88;
  VmValue *loadInst;
  VmInstruction **local_78;
  uint local_70;
  undefined4 uStack_6c;
  VmConstant *local_68;
  VmConstant *local_60;
  VmConstant *constant;
  VmInstruction *local_50;
  VmInstruction *inst;
  VmInstruction *local_40;
  VmInstruction *instruction;
  bool hadUpdate;
  VariableData *pVStack_30;
  uint oldSize;
  VariableData *variable_local;
  SmallArray<VmValue_*,_32U> *stack_local;
  VmBlock *block_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  phiNodes_00 = phiNodes;
  pVStack_30 = variable;
  variable_local = (VariableData *)stack;
  stack_local = (SmallArray<VmValue_*,_32U> *)block;
  block_local = (VmBlock *)module;
  module_local = (VmModule *)ctx;
  instruction._4_4_ = SmallArray<VmValue_*,_32U>::size(stack);
  instruction._3_1_ = 0;
  for (local_40 = (VmInstruction *)stack_local->little[0x17]; phiNodes._0_12_ = phiNodes_00._0_12_,
      auVar3 = (undefined1  [12])phiNodes._0_12_, local_40 != (VmInstruction *)0x0;
      local_40 = local_40->nextSibling) {
    bVar7 = IsMemoryLoadOfVariable(local_40,pVStack_30);
    if (bVar7) {
      (local_40->super_VmValue).canBeRemoved = false;
      if ((stack_local->little[0x15] == (VmValue *)0x0) &&
         (bVar7 = SmallArray<VmValue_*,_32U>::empty((SmallArray<VmValue_*,_32U> *)variable_local),
         bVar7)) {
        inst = local_40;
        SmallArray<VmValue_*,_32U>::push_back
                  ((SmallArray<VmValue_*,_32U> *)variable_local,(VmValue **)&inst);
      }
      else {
        pVVar2 = block_local;
        original = local_40;
        ppVVar9 = SmallArray<VmValue_*,_32U>::back((SmallArray<VmValue_*,_32U> *)variable_local);
        anon_unknown.dwarf_1a3010::ReplaceValueUsersWith
                  ((VmModule *)pVVar2,&original->super_VmValue,*ppVVar9,(uint *)0x0);
      }
      (local_40->super_VmValue).canBeRemoved = true;
    }
    bVar7 = IsMemoryStoreToVariable(local_40,pVStack_30);
    if (bVar7) {
      ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&local_40->arguments,2);
      local_50 = getType<VmInstruction>(*ppVVar9);
      pVVar4 = variable_local;
      if (local_50 == (VmInstruction *)0x0) {
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&local_40->arguments,2);
        local_60 = getType<VmConstant>(*ppVVar9);
        if (local_60 == (VmConstant *)0x0) {
          __assert_fail("!\"unknown argument type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1718,
                        "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                       );
        }
        instruction._3_1_ = 1;
        local_68 = local_60;
        SmallArray<VmValue_*,_32U>::push_back
                  ((SmallArray<VmValue_*,_32U> *)variable_local,(VmValue **)&local_68);
      }
      else {
        instruction._3_1_ = 1;
        pSVar1 = pVStack_30->name;
        (local_50->super_VmValue).comment.begin = (pSVar1->name).begin;
        (local_50->super_VmValue).comment.end = (pSVar1->name).end;
        constant = (VmConstant *)getType<VmInstruction>(&local_50->super_VmValue);
        SmallArray<VmValue_*,_32U>::push_back
                  ((SmallArray<VmValue_*,_32U> *)pVVar4,(VmValue **)&constant);
      }
    }
    else {
      phiNodes.data = phiNodes_00.data;
      local_78 = phiNodes.data;
      local_70 = phiNodes_00.count;
      uStack_6c = phiNodes_00._12_4_;
      phiNodes_01._12_4_ = 0;
      phiNodes.data = auVar3._0_8_;
      phiNodes.count = auVar3._8_4_;
      phiNodes_01.data = phiNodes.data;
      phiNodes_01.count = phiNodes.count;
      bVar7 = IsPhiOfVariable(local_40,phiNodes_01);
      if (bVar7) {
        loadInst = &local_40->super_VmValue;
        SmallArray<VmValue_*,_32U>::push_back
                  ((SmallArray<VmValue_*,_32U> *)variable_local,&loadInst);
      }
    }
  }
  if ((stack_local->little[0x15] == (VmValue *)0x0) &&
     (bVar7 = SmallArray<VmValue_*,_32U>::empty((SmallArray<VmValue_*,_32U> *)variable_local), bVar7
     )) {
    (block_local->super_VmValue).comment.end = (char *)stack_local;
    while( true ) {
      local_129 = false;
      if (stack_local->little[0x19] != (VmValue *)0x0) {
        local_129 = anon_unknown.dwarf_1a3010::IsBlockTerminator
                              (*(VmInstructionType *)&stack_local->little[0x19][1]._vptr_VmValue);
      }
      if (local_129 == false) break;
      stack_local->little[0x19] = *(VmValue **)&stack_local->little[0x19][1].users.count;
    }
    bVar7 = IsArgumentVariable((FunctionData *)stack_local->little[0x14][1]._vptr_VmValue,pVStack_30
                              );
    pVVar6 = module_local;
    pVVar2 = block_local;
    pVVar4 = pVStack_30;
    if (bVar7) {
      type = pVStack_30->type;
      structType = ExpressionContext::GetReferenceType
                             ((ExpressionContext *)module_local,pVStack_30->type);
      pVVar11 = anon_unknown.dwarf_1a3010::CreateVariableAddress
                          ((VmModule *)pVVar2,(SynBase *)0x0,pVVar4,&structType->super_TypeBase);
      local_88 = anon_unknown.dwarf_1a3010::CreateLoad
                           ((ExpressionContext *)pVVar6,(VmModule *)pVVar2,(SynBase *)0x0,type,
                            pVVar11,0);
      pVVar4 = variable_local;
      pSVar1 = pVStack_30->name;
      (local_88->comment).begin = (pSVar1->name).begin;
      (local_88->comment).end = (pSVar1->name).end;
      loadInst_1 = &getType<VmInstruction>(local_88)->super_VmValue;
      SmallArray<VmValue_*,_32U>::push_back((SmallArray<VmValue_*,_32U> *)pVVar4,&loadInst_1);
    }
    else {
      vmType.structType = (TypeBase *)0x0;
      _local_a8 = GetVmType((ExpressionContext *)module_local,pVStack_30->type);
      bVar7 = VmType::operator==((VmType *)local_a8,&VmType::Int);
      pVVar2 = block_local;
      if (bVar7) {
        pVVar10 = CreateConstantInt((Allocator *)block_local[8].liveOut.little[0],(SynBase *)0x0,0);
        vmType.structType =
             (TypeBase *)
             anon_unknown.dwarf_1a3010::CreateLoadImmediate
                       ((VmModule *)pVVar2,(SynBase *)0x0,pVVar10);
      }
      else {
        bVar7 = VmType::operator==((VmType *)local_a8,&VmType::Double);
        pVVar2 = block_local;
        if (bVar7) {
          pVVar10 = CreateConstantDouble
                              ((Allocator *)block_local[8].liveOut.little[0],(SynBase *)0x0,0.0);
          vmType.structType =
               (TypeBase *)
               anon_unknown.dwarf_1a3010::CreateLoadImmediate
                         ((VmModule *)pVVar2,(SynBase *)0x0,pVVar10);
        }
        else {
          bVar7 = VmType::operator==((VmType *)local_a8,&VmType::Long);
          pVVar2 = block_local;
          if ((!bVar7) && (local_a8._0_4_ != VM_TYPE_POINTER)) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x173e,
                          "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                         );
          }
          pVVar10 = CreateConstantLong((Allocator *)block_local[8].liveOut.little[0],(SynBase *)0x0,
                                       0);
          vmType.structType =
               (TypeBase *)
               anon_unknown.dwarf_1a3010::CreateLoadImmediate
                         ((VmModule *)pVVar2,(SynBase *)0x0,pVVar10);
        }
      }
      pVVar4 = variable_local;
      pSVar1 = pVStack_30->name;
      *(char **)&(vmType.structType)->typeIndex = (pSVar1->name).begin;
      (vmType.structType)->size = (longlong)(pSVar1->name).end;
      constant_1 = (VmConstant *)getType<VmInstruction>((VmValue *)vmType.structType);
      SmallArray<VmValue_*,_32U>::push_back
                ((SmallArray<VmValue_*,_32U> *)pVVar4,(VmValue **)&constant_1);
    }
    (block_local->super_VmValue).comment.end = (char *)0x0;
  }
  else if ((instruction._3_1_ & 1) != 0) {
    (block_local->super_VmValue).comment.end = (char *)stack_local;
    stack_local->little[0x19] = *(VmValue **)&stack_local->little[0x18][1].users.count;
    ppVVar9 = SmallArray<VmValue_*,_32U>::back((SmallArray<VmValue_*,_32U> *)variable_local);
    pVVar10 = getType<VmConstant>(*ppVVar9);
    if (pVVar10 != (VmConstant *)0x0) {
      pVVar11 = anon_unknown.dwarf_1a3010::CreateLoadImmediate
                          ((VmModule *)block_local,(pVVar10->super_VmValue).source,pVVar10);
      pSVar1 = pVStack_30->name;
      (pVVar11->comment).begin = (pSVar1->name).begin;
      (pVVar11->comment).end = (pSVar1->name).end;
      ppVVar9 = SmallArray<VmValue_*,_32U>::back((SmallArray<VmValue_*,_32U> *)variable_local);
      *ppVVar9 = pVVar11;
    }
    stack_local->little[0x19] = stack_local->little[0x18];
    (block_local->super_VmValue).comment.end = (char *)0x0;
  }
  successor._4_4_ = 0;
  while( true ) {
    uVar8 = SmallArray<VmBlock_*,_4U>::size((SmallArray<VmBlock_*,_4U> *)&stack_local[1].count);
    if (uVar8 <= successor._4_4_) {
      for (local_f4 = 0;
          uVar8 = SmallArray<VmBlock_*,_4U>::size
                            ((SmallArray<VmBlock_*,_4U> *)(stack_local[1].little + 0x11)),
          pVVar6 = module_local, pVVar2 = block_local, local_f4 < uVar8; local_f4 = local_f4 + 1) {
        ppVVar12 = SmallArray<VmBlock_*,_4U>::operator[]
                             ((SmallArray<VmBlock_*,_4U> *)(stack_local[1].little + 0x11),local_f4);
        RenameMemoryToRegister
                  ((ExpressionContext *)pVVar6,(VmModule *)pVVar2,*ppVVar12,
                   (SmallArray<VmValue_*,_32U> *)variable_local,pVStack_30,phiNodes_00);
      }
      SmallArray<VmValue_*,_32U>::shrink
                ((SmallArray<VmValue_*,_32U> *)variable_local,instruction._4_4_);
      return;
    }
    ppVVar12 = SmallArray<VmBlock_*,_4U>::operator[]
                         ((SmallArray<VmBlock_*,_4U> *)&stack_local[1].count,successor._4_4_);
    pVVar2 = *ppVVar12;
    inst_1._4_4_ = 0xffffffff;
    for (inst_1._0_4_ = 0; uVar8 = SmallArray<VmBlock_*,_4U>::size(&pVVar2->predecessors),
        pSVar5 = stack_local, (uint)inst_1 < uVar8 && inst_1._4_4_ == 0xffffffff;
        inst_1._0_4_ = (uint)inst_1 + 1) {
      ppVVar12 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar2->predecessors,(uint)inst_1);
      if ((VmBlock *)pSVar5 == *ppVVar12) {
        inst_1._4_4_ = (uint)inst_1;
      }
    }
    if (inst_1._4_4_ == 0xffffffff) break;
    for (local_e0 = pVVar2->firstInstruction;
        (local_e0 != (VmInstruction *)0x0 && (local_e0->cmd == VM_INST_PHI));
        local_e0 = local_e0->nextSibling) {
      phiNodes_02._12_4_ = 0;
      phiNodes_02.data = phiNodes.data;
      phiNodes_02.count = phiNodes.count;
      bVar7 = IsPhiOfVariable(local_e0,phiNodes_02);
      if (bVar7) {
        ppVVar9 = SmallArray<VmValue_*,_32U>::back((SmallArray<VmValue_*,_32U> *)variable_local);
        pVVar11 = *ppVVar9;
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&local_e0->arguments,inst_1._4_4_ << 1);
        *ppVVar9 = pVVar11;
        ppVVar9 = SmallArray<VmValue_*,_32U>::back((SmallArray<VmValue_*,_32U> *)variable_local);
        VmValue::AddUse(*ppVVar9,&local_e0->super_VmValue);
      }
    }
    successor._4_4_ = successor._4_4_ + 1;
  }
  __assert_fail("j != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x1768,
                "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
               );
}

Assistant:

void RenameMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmBlock *block, SmallArray<VmValue*, 32> &stack, VariableData *variable, ArrayView<VmInstruction*> phiNodes)
{
	unsigned oldSize = stack.size();

	bool hadUpdate = false;

	for(VmInstruction *instruction = block->firstInstruction; instruction; instruction = instruction->nextSibling)
	{
		if(IsMemoryLoadOfVariable(instruction, variable))
		{
			// Do not reorder instruction stream, perform a separate dead instruction elimination pass later
			instruction->canBeRemoved = false;

			if(!block->prevSibling && stack.empty())
				stack.push_back(instruction);
			else
				ReplaceValueUsersWith(module, instruction, stack.back(), NULL);

			instruction->canBeRemoved = true;
		}

		if(IsMemoryStoreToVariable(instruction, variable))
		{
			if(VmInstruction *inst = getType<VmInstruction>(instruction->arguments[2]))
			{
				hadUpdate = true;

				inst->comment = variable->name->name;

				stack.push_back(getType<VmInstruction>(inst));
			}
			else if(VmConstant *constant = getType<VmConstant>(instruction->arguments[2]))
			{
				hadUpdate = true;

				stack.push_back(constant);
			}
			else
			{
				assert(!"unknown argument type");
			}
		}
		else if(IsPhiOfVariable(instruction, phiNodes))
		{
			stack.push_back(instruction);
		}
	}

	// If we have completed the entry block and there was no definition of the variable, create an argument load or a constant zero for a local
	if(!block->prevSibling && stack.empty())
	{
		module->currentBlock = block;

		while(block->insertPoint && IsBlockTerminator(block->insertPoint->cmd))
			block->insertPoint = block->insertPoint->prevSibling;

		if(IsArgumentVariable(block->parent->function, variable))
		{
			VmValue *loadInst = CreateLoad(ctx, module, NULL, variable->type, CreateVariableAddress(module, NULL, variable, ctx.GetReferenceType(variable->type)), 0);

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}
		else
		{
			VmValue *loadInst = NULL;

			VmType vmType = GetVmType(ctx, variable->type);

			if(vmType == VmType::Int || (NULLC_PTR_SIZE == 4 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantInt(module->allocator, NULL, 0));
			else if(vmType == VmType::Double)
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantDouble(module->allocator, NULL, 0));
			else if(vmType == VmType::Long || (NULLC_PTR_SIZE == 8 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantLong(module->allocator, NULL, 0));
			else
				assert(!"unknown type");

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}

		module->currentBlock = NULL;
	}
	else if(hadUpdate)
	{
		// Finalize last value before terminator instruction
		module->currentBlock = block;
		block->insertPoint = block->lastInstruction->prevSibling;

		if(VmConstant *constant = getType<VmConstant>(stack.back()))
		{
			// Create immediate load for final constant value
			VmValue *loadInst = CreateLoadImmediate(module, constant->source, constant);

			loadInst->comment = variable->name->name;

			stack.back() = loadInst;
		}

		block->insertPoint = block->lastInstruction;
		module->currentBlock = NULL;
	}

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		// Find which predecessor is the X for Y
		unsigned j = ~0u;

		for(unsigned k = 0; k < successor->predecessors.size() && j == ~0u; k++)
		{
			if(block == successor->predecessors[k])
				j = k;
		}

		assert(j != ~0u);

		// Find phi node for current variable
		for(VmInstruction *inst = successor->firstInstruction; inst; inst = inst->nextSibling)
		{
			// We won't find any phi instructions after the last one
			if(inst->cmd != VM_INST_PHI)
				break;

			if(IsPhiOfVariable(inst, phiNodes))
			{
				inst->arguments[j * 2] = stack.back();

				stack.back()->AddUse(inst);
			}
		}
	}

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
		RenameMemoryToRegister(ctx, module, block->dominanceChildren[i], stack, variable, phiNodes);

	stack.shrink(oldSize);
}